

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ListReverseSortFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffff9e4;
  undefined4 in_stack_fffffffffffff9ec;
  FunctionNullHandling in_stack_fffffffffffff9f8;
  allocator_type local_601;
  bind_lambda_function_t in_stack_fffffffffffffa00;
  code *local_5e8 [2];
  code *local_5d8;
  code *local_5d0;
  code *local_5c8 [2];
  code *local_5b8;
  code *local_5b0;
  LogicalType local_5a8;
  LogicalType local_590 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_548;
  LogicalType local_530;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_518;
  LogicalType local_500;
  LogicalType local_4e8;
  ScalarFunction sort_reverse_null_order;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction sort_reverse;
  
  LogicalType::LogicalType(local_590,ANY);
  LogicalType::LIST((LogicalType *)&sort_reverse_null_order,local_590);
  __l._M_len = 1;
  __l._M_array = (iterator)&sort_reverse_null_order;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_518,__l,(allocator_type *)&local_5a8);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffa00,ANY);
  LogicalType::LIST(&local_530,(LogicalType *)&stack0xfffffffffffffa00);
  local_5c8[1] = (code *)0x0;
  local_5c8[0] = ListSortFunction;
  local_5b0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_5b8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_4e8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_4e8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff9e4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff9ec;
  ScalarFunction::ScalarFunction
            (&sort_reverse,(vector<duckdb::LogicalType,_true> *)&local_518,&local_530,
             (scalar_function_t *)local_5c8,ListReverseSortBind,(bind_scalar_function_extended_t)0x0
             ,(function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffff9f8,in_stack_fffffffffffffa00);
  LogicalType::~LogicalType(&local_4e8);
  ::std::_Function_base::~_Function_base((_Function_base *)local_5c8);
  LogicalType::~LogicalType(&local_530);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffa00);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_518);
  LogicalType::~LogicalType((LogicalType *)&sort_reverse_null_order);
  LogicalType::~LogicalType(local_590);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffa00,ANY);
  LogicalType::LIST(local_590,(LogicalType *)&stack0xfffffffffffffa00);
  LogicalType::LogicalType(local_590 + 1,VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = local_590;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_548,__l_00,&local_601);
  LogicalType::LogicalType(&local_5a8,ANY);
  LogicalType::LIST(local_590 + 2,&local_5a8);
  local_5e8[1] = (code *)0x0;
  local_5e8[0] = ListSortFunction;
  local_5d0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_5d8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_500,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_500;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff9e4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff9ec;
  ScalarFunction::ScalarFunction
            (&sort_reverse_null_order,(vector<duckdb::LogicalType,_true> *)&local_548,local_590 + 2,
             (scalar_function_t *)local_5e8,ListReverseSortBind,(bind_scalar_function_extended_t)0x0
             ,(function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffff9f8,in_stack_fffffffffffffa00);
  LogicalType::~LogicalType(&local_500);
  ::std::_Function_base::~_Function_base((_Function_base *)local_5e8);
  LogicalType::~LogicalType(local_590 + 2);
  LogicalType::~LogicalType(&local_5a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_548);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_590[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffa00);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  ScalarFunction::ScalarFunction(&local_280,&sort_reverse);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  ScalarFunction::ScalarFunction(&local_3a8,&sort_reverse_null_order);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  ScalarFunction::~ScalarFunction(&sort_reverse_null_order);
  ScalarFunction::~ScalarFunction(&sort_reverse);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListReverseSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort_reverse({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY),
	                            ListSortFunction, ListReverseSortBind);

	// two parameters: list, null order
	ScalarFunction sort_reverse_null_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                                       LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListReverseSortBind);

	ScalarFunctionSet list_reverse_sort;
	list_reverse_sort.AddFunction(sort_reverse);
	list_reverse_sort.AddFunction(sort_reverse_null_order);
	return list_reverse_sort;
}